

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O0

BOOL Js::JavascriptOperators::GetPropertyObject
               (Var instance,ScriptContext *scriptContext,RecyclableObject **propertyObject)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  undefined4 *puVar4;
  JavascriptLibrary *this;
  DynamicObject *pDVar5;
  RecyclableObject *instance_00;
  RecyclableObject *object;
  RecyclableObject **propertyObject_local;
  ScriptContext *scriptContext_local;
  Var instance_local;
  
  if (propertyObject == (RecyclableObject **)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                ,0x84d,"(propertyObject)","propertyObject");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  bVar2 = TaggedNumber::Is(instance);
  if (bVar2) {
    this = ScriptContext::GetLibrary(scriptContext);
    pDVar5 = JavascriptLibraryBase::GetNumberPrototype(&this->super_JavascriptLibraryBase);
    *propertyObject = &pDVar5->super_RecyclableObject;
    instance_local._4_4_ = 1;
  }
  else {
    instance_00 = UnsafeVarTo<Js::RecyclableObject>(instance);
    *propertyObject = instance_00;
    BVar3 = IsUndefinedOrNull(instance_00);
    if (BVar3 == 0) {
      instance_local._4_4_ = 1;
    }
    else {
      instance_local._4_4_ = 0;
    }
  }
  return instance_local._4_4_;
}

Assistant:

BOOL JavascriptOperators::GetPropertyObject(Var instance, ScriptContext * scriptContext, RecyclableObject** propertyObject)
    {
        Assert(propertyObject);
        if (TaggedNumber::Is(instance))
        {
            *propertyObject = scriptContext->GetLibrary()->GetNumberPrototype();
            return TRUE;
        }
        RecyclableObject* object = UnsafeVarTo<RecyclableObject>(instance);
        *propertyObject = object;
        if (JavascriptOperators::IsUndefinedOrNull(object))
        {
            return FALSE;
        }
        return TRUE;
    }